

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::looksLikeNumber(string *string,size_t index)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  size_t index_local;
  string *string_local;
  
  uVar2 = std::__cxx11::string::size();
  if (index < uVar2) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
    bVar1 = isDigitCharacter(*pcVar3);
    if (bVar1) {
      string_local._7_1_ = true;
    }
    else {
      uVar2 = std::__cxx11::string::size();
      if (uVar2 < index + 2) {
        string_local._7_1_ = false;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
        if (((*pcVar3 == '.') &&
            (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), '/' < *pcVar3)) &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 < ':')) {
          string_local._7_1_ = true;
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
          if ((*pcVar3 == '-') ||
             (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == '+')) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string);
            if (('/' < *pcVar3) &&
               (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 < ':')) {
              return true;
            }
            uVar2 = std::__cxx11::string::size();
            if (((index + 3 <= uVar2) &&
                (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), *pcVar3 == '.'))
               && ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string), '/' < *pcVar3
                   && (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)string),
                      *pcVar3 < ':')))) {
              return true;
            }
          }
          string_local._7_1_ = false;
        }
      }
    }
  }
  else {
    string_local._7_1_ = false;
  }
  return string_local._7_1_;
}

Assistant:

static bool looksLikeNumber(const std::string& string, size_t index)
{
    if (string.size() <= index) {
        return false;
    }
    if (isDigitCharacter(string[index])) {
        return true;
    }
    if (string.size() < index + 2) {
        return false;
    }
    if (string[index] == '.' &&
        (string[index + 1] >= '0' && string[index + 1] <= '9')) {
        return true;
    }
    if (string[index] == '-' || string[index] == '+') {
        if (string[index + 1] >= '0' && string[index + 1] <= '9') {
            return true;
        }
        if (string.size() >= index + 3 && string[index + 1] == '.' &&
            (string[index + 2] >= '0' && string[index + 2] <= '9')) {
            return true;
        }
    }
    return false;
}